

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O2

void increment_int_ptr(MACROBLOCKD *xd,int rel_mi_row,int rel_mi_col,uint8_t op_mi_size,int dir,
                      MB_MODE_INFO *mi,void *fun_ctxt,int num_planes)

{
  *(char *)fun_ctxt = *fun_ctxt + '\x01';
  return;
}

Assistant:

static inline void increment_int_ptr(MACROBLOCKD *xd, int rel_mi_row,
                                     int rel_mi_col, uint8_t op_mi_size,
                                     int dir, MB_MODE_INFO *mi, void *fun_ctxt,
                                     const int num_planes) {
  (void)xd;
  (void)rel_mi_row;
  (void)rel_mi_col;
  (void)op_mi_size;
  (void)dir;
  (void)mi;
  ++*(uint8_t *)fun_ctxt;
  (void)num_planes;
}